

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIRToDOT.cpp
# Opt level: O0

void __thiscall
OpenMPToClause::generateDOT
          (OpenMPToClause *this,ofstream *dot_file,int depth,int index,string *parent_node)

{
  bool bVar1;
  OpenMPToClauseKind OVar2;
  char *pcVar3;
  long lVar4;
  reference ppcVar5;
  allocator<char> local_731;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_730;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_710;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_690;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_670;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_650;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_630;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_610;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5d0;
  string local_5b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_590;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_570;
  __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
  local_550;
  char **local_548;
  undefined1 local_540 [8];
  string expr_name;
  iterator iStack_518;
  int expr_index;
  iterator it;
  vector<const_char_*,_std::allocator<const_char_*>_> *expr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_488;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_468;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_448;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_428;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  undefined1 local_3a8 [8];
  string mapper_identifier_name;
  string node_id_1;
  string mapper_identifier;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  undefined1 local_1e8 [8];
  string node_id;
  string parameter_string;
  undefined1 local_1a0 [4];
  OpenMPToClauseKind kind;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  string local_120;
  string local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  undefined1 local_a0 [8];
  string clause_kind;
  allocator<char> local_69;
  undefined1 local_68 [8];
  string indent;
  string current_line;
  string *parent_node_local;
  int index_local;
  int depth_local;
  ofstream *dot_file_local;
  OpenMPToClause *this_local;
  
  std::__cxx11::string::string((string *)(indent.field_2._M_local_buf + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_68,(long)depth,'\t',&local_69);
  std::allocator<char>::~allocator(&local_69);
  std::__cxx11::to_string(&local_100,depth);
  std::operator+(&local_e0,"to_",&local_100);
  std::operator+(&local_c0,&local_e0,"_");
  std::__cxx11::to_string(&local_120,index);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                 &local_c0,&local_120);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_100);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
                 parent_node);
  std::operator+(&local_180,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a0,
                 "-- ");
  std::operator+(&local_160,&local_180,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
  std::operator+(&local_140,&local_160,"\n");
  std::__cxx11::string::operator=((string *)(indent.field_2._M_local_buf + 8),(string *)&local_140);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)&local_180);
  std::__cxx11::string::~string((string *)local_1a0);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  std::operator<<((ostream *)dot_file,pcVar3);
  std::__cxx11::string::operator+=((string *)local_68,"\t");
  OVar2 = getKind(this);
  std::__cxx11::string::string((string *)(node_id.field_2._M_local_buf + 8));
  if (OVar2 == OMPC_TO_mapper) {
    std::__cxx11::string::operator=((string *)(node_id.field_2._M_local_buf + 8),"mapper");
  }
  lVar4 = std::__cxx11::string::size();
  if (lVar4 != 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                   "_kind");
    std::operator+(&local_268,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
    std::operator+(&local_248,&local_268," -- ");
    std::operator+(&local_228,&local_248,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8);
    std::operator+(&local_208,&local_228,"\n");
    std::__cxx11::string::operator=
              ((string *)(indent.field_2._M_local_buf + 8),(string *)&local_208);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::string::~string((string *)&local_268);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    std::operator<<((ostream *)dot_file,pcVar3);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&mapper_identifier.field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
                   "\t");
    std::operator+(&local_328,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&mapper_identifier.field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8);
    std::operator+(&local_308,&local_328," [label = \"");
    std::operator+(&local_2e8,&local_308,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8);
    std::operator+(&local_2c8,&local_2e8,"\\n ");
    std::operator+(&local_2a8,&local_2c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&node_id.field_2 + 8));
    std::operator+(&local_288,&local_2a8,"\"]\n");
    std::__cxx11::string::operator=
              ((string *)(indent.field_2._M_local_buf + 8),(string *)&local_288);
    std::__cxx11::string::~string((string *)&local_288);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::__cxx11::string::~string((string *)&local_2c8);
    std::__cxx11::string::~string((string *)&local_2e8);
    std::__cxx11::string::~string((string *)&local_308);
    std::__cxx11::string::~string((string *)&local_328);
    std::__cxx11::string::~string((string *)(mapper_identifier.field_2._M_local_buf + 8));
    pcVar3 = (char *)std::__cxx11::string::c_str();
    std::operator<<((ostream *)dot_file,pcVar3);
    std::__cxx11::string::~string((string *)local_1e8);
  }
  getMapperIdentifier_abi_cxx11_((string *)((long)&node_id_1.field_2 + 8),this);
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          ((long)&node_id_1.field_2 + 8),"");
  if (bVar1) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&mapper_identifier_name.field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                   "_kind");
    std::__cxx11::string::operator=
              ((string *)(node_id.field_2._M_local_buf + 8),
               (string *)(node_id_1.field_2._M_local_buf + 8));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3a8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                   "_mapper_identifier");
    std::operator+(&local_428,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&mapper_identifier_name.field_2 + 8));
    std::operator+(&local_408,&local_428," -- ");
    std::operator+(&local_3e8,&local_408,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3a8);
    std::operator+(&local_3c8,&local_3e8,"\n");
    std::__cxx11::string::operator=
              ((string *)(indent.field_2._M_local_buf + 8),(string *)&local_3c8);
    std::__cxx11::string::~string((string *)&local_3c8);
    std::__cxx11::string::~string((string *)&local_3e8);
    std::__cxx11::string::~string((string *)&local_408);
    std::__cxx11::string::~string((string *)&local_428);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    std::operator<<((ostream *)dot_file,pcVar3);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&expr,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
                   "\t");
    std::operator+(&local_4e8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&expr,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3a8);
    std::operator+(&local_4c8,&local_4e8," [label = \"");
    std::operator+(&local_4a8,&local_4c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3a8);
    std::operator+(&local_488,&local_4a8,"\\n ");
    std::operator+(&local_468,&local_488,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&node_id.field_2 + 8));
    std::operator+(&local_448,&local_468,"\"]\n");
    std::__cxx11::string::operator=
              ((string *)(indent.field_2._M_local_buf + 8),(string *)&local_448);
    std::__cxx11::string::~string((string *)&local_448);
    std::__cxx11::string::~string((string *)&local_468);
    std::__cxx11::string::~string((string *)&local_488);
    std::__cxx11::string::~string((string *)&local_4a8);
    std::__cxx11::string::~string((string *)&local_4c8);
    std::__cxx11::string::~string((string *)&local_4e8);
    std::__cxx11::string::~string((string *)&expr);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    std::operator<<((ostream *)dot_file,pcVar3);
    std::__cxx11::string::~string((string *)local_3a8);
    std::__cxx11::string::~string((string *)(mapper_identifier_name.field_2._M_local_buf + 8));
  }
  it._M_current = (char **)OpenMPClause::getExpressions(&this->super_OpenMPClause);
  if ((vector<const_char_*,_std::allocator<const_char_*>_> *)it._M_current !=
      (vector<const_char_*,_std::allocator<const_char_*>_> *)0x0) {
    __gnu_cxx::
    __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>::
    __normal_iterator(&stack0xfffffffffffffae8);
    expr_name.field_2._12_4_ = 0;
    std::__cxx11::string::string((string *)local_540);
    local_548 = (char **)std::vector<const_char_*,_std::allocator<const_char_*>_>::begin
                                   (it._M_current);
    iStack_518 = (iterator)local_548;
    while( true ) {
      local_550._M_current =
           (char **)std::vector<const_char_*,_std::allocator<const_char_*>_>::end(it._M_current);
      bVar1 = __gnu_cxx::operator!=(&stack0xfffffffffffffae8,&local_550);
      if (!bVar1) break;
      std::operator+(&local_590,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                     "_expr");
      std::__cxx11::to_string(&local_5b0,expr_name.field_2._12_4_);
      std::operator+(&local_570,&local_590,&local_5b0);
      std::__cxx11::string::operator=((string *)local_540,(string *)&local_570);
      std::__cxx11::string::~string((string *)&local_570);
      std::__cxx11::string::~string((string *)&local_5b0);
      std::__cxx11::string::~string((string *)&local_590);
      expr_name.field_2._12_4_ = expr_name.field_2._12_4_ + 1;
      std::operator+(&local_630,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
      std::operator+(&local_610,&local_630," -- ");
      std::operator+(&local_5f0,&local_610,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_540)
      ;
      std::operator+(&local_5d0,&local_5f0,"\n");
      std::__cxx11::string::operator=
                ((string *)(indent.field_2._M_local_buf + 8),(string *)&local_5d0);
      std::__cxx11::string::~string((string *)&local_5d0);
      std::__cxx11::string::~string((string *)&local_5f0);
      std::__cxx11::string::~string((string *)&local_610);
      std::__cxx11::string::~string((string *)&local_630);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      std::operator<<((ostream *)dot_file,pcVar3);
      std::operator+(&local_710,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
                     "\t");
      std::operator+(&local_6f0,&local_710,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_540)
      ;
      std::operator+(&local_6d0,&local_6f0," [label = \"");
      std::operator+(&local_6b0,&local_6d0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_540)
      ;
      std::operator+(&local_690,&local_6b0,"\\n ");
      ppcVar5 = __gnu_cxx::
                __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
                ::operator*(&stack0xfffffffffffffae8);
      pcVar3 = *ppcVar5;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_730,pcVar3,&local_731);
      std::operator+(&local_670,&local_690,&local_730);
      std::operator+(&local_650,&local_670,"\"]\n");
      std::__cxx11::string::operator=
                ((string *)(indent.field_2._M_local_buf + 8),(string *)&local_650);
      std::__cxx11::string::~string((string *)&local_650);
      std::__cxx11::string::~string((string *)&local_670);
      std::__cxx11::string::~string((string *)&local_730);
      std::allocator<char>::~allocator(&local_731);
      std::__cxx11::string::~string((string *)&local_690);
      std::__cxx11::string::~string((string *)&local_6b0);
      std::__cxx11::string::~string((string *)&local_6d0);
      std::__cxx11::string::~string((string *)&local_6f0);
      std::__cxx11::string::~string((string *)&local_710);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      std::operator<<((ostream *)dot_file,pcVar3);
      __gnu_cxx::
      __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>::
      operator++(&stack0xfffffffffffffae8,0);
    }
    std::__cxx11::string::~string((string *)local_540);
  }
  std::__cxx11::string::~string((string *)(node_id_1.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(node_id.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_a0);
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string((string *)(indent.field_2._M_local_buf + 8));
  return;
}

Assistant:

void OpenMPToClause::generateDOT(std::ofstream& dot_file, int depth, int index, std::string parent_node) {

    std::string current_line;
    std::string indent = std::string(depth, '\t');

    std::string clause_kind = "to_" + std::to_string(depth) + "_" + std::to_string(index);
    current_line = indent + parent_node + "-- " + clause_kind + "\n";
    dot_file << current_line.c_str();
    indent += "\t";
    OpenMPToClauseKind kind = this->getKind();
    std::string parameter_string;
    switch (kind) {
        case OMPC_TO_mapper:
            parameter_string = "mapper";
            break;
        default:
            ;
    };

    if (parameter_string.size() > 0) {
        std::string node_id = clause_kind + "_kind";
        current_line = indent + clause_kind + " -- " + node_id + "\n";
        dot_file << current_line.c_str();
        current_line = indent + "\t" + node_id + " [label = \"" + node_id + "\\n " + parameter_string + "\"]\n";
        dot_file << current_line.c_str();
    };
    std::string mapper_identifier = this->getMapperIdentifier();
    if (mapper_identifier != "") {
    std::string node_id =  clause_kind+ "_kind";
        parameter_string = mapper_identifier;
        std::string mapper_identifier_name = clause_kind + "_mapper_identifier";
        current_line = indent + node_id + " -- " + mapper_identifier_name + "\n";
        dot_file << current_line.c_str();
        current_line = indent + "\t" + mapper_identifier_name + " [label = \"" + mapper_identifier_name + "\\n " + parameter_string + "\"]\n";
        dot_file << current_line.c_str();
    };    


 std::vector<const char*>* expr = this->getExpressions();
    if (expr != NULL) {
        std::vector<const char*>::iterator it;
        int expr_index = 0;
        std::string expr_name;
        for (it = expr->begin(); it != expr->end(); it++) {
            expr_name = clause_kind + "_expr" + std::to_string(expr_index);
            expr_index += 1;
            current_line = indent + clause_kind + " -- " + expr_name + "\n";
            dot_file << current_line.c_str();
            current_line = indent + "\t" + expr_name + " [label = \"" + expr_name + "\\n " + std::string(*it) + "\"]\n";
            dot_file << current_line.c_str();
        };
    };

}